

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorpickermenu.cpp
# Opt level: O0

DMenu * StartPickerMenu(DMenu *parent,char *name,FColorCVar *cvar)

{
  DColorPickerMenu *this;
  FName *key;
  FName local_34;
  FMenuDescriptor **local_30;
  FMenuDescriptor **desc;
  FColorCVar *cvar_local;
  char *name_local;
  DMenu *parent_local;
  
  desc = (FMenuDescriptor **)cvar;
  cvar_local = (FColorCVar *)name;
  name_local = (char *)parent;
  FName::FName(&local_34,NAME_Colorpickermenu);
  key = &local_34;
  local_30 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
             CheckKey(&MenuDescriptors,key);
  if ((local_30 == (FMenuDescriptor **)0x0) || ((*local_30)->mType != 1)) {
    parent_local = (DMenu *)0x0;
  }
  else {
    this = (DColorPickerMenu *)DObject::operator_new((DObject *)0x68,(size_t)key);
    DColorPickerMenu::DColorPickerMenu
              (this,(DMenu *)name_local,(char *)cvar_local,(FOptionMenuDescriptor *)*local_30,
               (FColorCVar *)desc);
    parent_local = (DMenu *)this;
  }
  return parent_local;
}

Assistant:

DMenu *StartPickerMenu(DMenu *parent, const char *name, FColorCVar *cvar)
{
	FMenuDescriptor **desc = MenuDescriptors.CheckKey(NAME_Colorpickermenu);
	if (desc != NULL && (*desc)->mType == MDESC_OptionsMenu)
	{
		return new DColorPickerMenu(parent, name, (FOptionMenuDescriptor*)(*desc), cvar);
	}
	else
	{
		return NULL;
	}
}